

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientImpl.cpp
# Opt level: O2

int __thiscall
SL::WS_LITE::WSClient_Configuration::connect
          (WSClient_Configuration *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  resolver_service<asio::ip::tcp> *prVar1;
  io_context_impl *piVar2;
  undefined8 uVar3;
  resolve_query_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_smasherprog[P]websocket_lite_src_ClientImpl_cpp:141:40)>
  *prVar4;
  undefined4 in_register_00000034;
  string *in_R9;
  __shared_ptr<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *in_stack_00000008;
  shared_ptr<SL::WS_LITE::WebSocket<false,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>_>
  socket;
  ptr local_218;
  shared_ptr<asio::ip::basic_resolver<asio::ip::tcp>_> resolver;
  shared_ptr<bool> connected;
  value_type res;
  __weak_ptr<void,_(__gnu_cxx::_Lock_policy)2> local_1b8;
  __shared_ptr<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2> local_1a8;
  __shared_ptr<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2> local_198;
  string portstr;
  undefined1 local_168 [72];
  string local_120 [32];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_100;
  __shared_ptr<asio::ip::basic_resolver<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2> local_c8;
  __shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2> local_b8;
  query query;
  
  p_Var5 = (__shared_ptr<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2> *)
           (CONCAT44(in_register_00000034,__fd) + 8);
  if (*(char *)(*(long *)(CONCAT44(in_register_00000034,__fd) + 8) + 0x28) == '\x01') {
    std::__shared_ptr<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_198,p_Var5);
    HubContext::getnextContext((HubContext *)&res);
    std::
    make_shared<SL::WS_LITE::WebSocket<false,asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>,std::shared_ptr<SL::WS_LITE::WebSocketContext>&,asio::io_context&,asio::ssl::context&>
              ((shared_ptr<SL::WS_LITE::WebSocketContext> *)&socket,
               (io_context *)
               &(res.super___shared_ptr<SL::WS_LITE::ThreadContext,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->WebSocketContext_,
               (context *)
               &(res.super___shared_ptr<SL::WS_LITE::ThreadContext,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->io_service);
    (socket.
     super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr)->SocketStatus_ = CONNECTING;
    std::__cxx11::to_string(&portstr,__len & 0xffff);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_168,portstr._M_dataplus._M_p,(allocator<char> *)&local_218);
    asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
              (&query,(string *)__addr,(string *)local_168,address_configured);
    std::__cxx11::string::~string((string *)local_168);
    std::make_shared<asio::ip::basic_resolver<asio::ip::tcp>,asio::io_context&>
              ((io_context *)&resolver);
    local_168._0_8_ = local_168._0_8_ & 0xffffffffffffff00;
    std::make_shared<bool,bool>((bool *)&connected);
    std::
    __shared_ptr<SL::WS_LITE::WebSocket<false,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr((__shared_ptr<SL::WS_LITE::WebSocket<false,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    *)local_168,
                   &socket.
                    super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  );
    std::__shared_ptr<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2> *)
               (local_168 + 0x10),&local_198);
    std::__cxx11::string::string((string *)(local_168 + 0x20),(string *)__addr);
    std::__cxx11::string::string(local_120,in_R9);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_Hashtable(&local_100,in_stack_00000008);
    std::__shared_ptr<asio::ip::basic_resolver<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr(&local_c8,
                 &resolver.
                  super___shared_ptr<asio::ip::basic_resolver<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>
                );
    std::__shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_b8,&connected.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>);
    prVar1 = ((resolver.
               super___shared_ptr<asio::ip::basic_resolver<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->super_basic_io_object<asio::detail::resolver_service<asio::ip::tcp>,_true>).
             service_;
    local_218.h = (type_conflict *)local_168;
    prVar4 = (resolve_query_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_smasherprog[P]websocket_lite_src_ClientImpl_cpp:141:40)>
              *)asio::asio_handler_allocate(0x178,(type_conflict *)local_168);
    local_218.p = (resolve_query_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_smasherprog[P]websocket_lite_src_ClientImpl_cpp:141:40)>
                   *)0x0;
    local_218.v = prVar4;
    std::__weak_ptr<void,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<void,void>
              ((__weak_ptr<void,(__gnu_cxx::_Lock_policy)2> *)&local_1b8,
               &((resolver.
                  super___shared_ptr<asio::ip::basic_resolver<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->
                super_basic_io_object<asio::detail::resolver_service<asio::ip::tcp>,_true>).
                implementation_.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>);
    piVar2 = (prVar1->super_resolver_service_base).io_context_impl_;
    asio::detail::resolve_op::resolve_op
              ((resolve_op *)prVar4,
               asio::detail::
               resolve_query_op<asio::ip::tcp,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/src/ClientImpl.cpp:141:40)>
               ::do_complete);
    std::__weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
              (&(prVar4->cancel_token_).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>,
               &local_1b8);
    asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query(&prVar4->query_,&query);
    prVar4->io_context_impl_ = piVar2;
    Connect<SL::WS_LITE::WSClient_Configuration::connect(std::__cxx11::string_const&,SL::WS_LITE::Explicit<unsigned_short,SL::WS_LITE::INTERNAL::PorNumbertTag>,bool,std::__cxx11::string_const&,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)::$_0&>(std::shared_ptr<SL::WS_LITE::HubContext>,std::__cxx11::string_const&,SL::WS_LITE::Explicit<unsigned_short,SL::WS_LITE::INTERNAL::PorNumbertTag>,bool,SL::WS_LITE::WSClient_Configuration::connect(std::__cxx11::string_const&,SL::WS_LITE::Explicit<unsigned_short,SL::WS_LITE::INTERNAL::PorNumbertTag>,bool,std::__cxx11::string_const&,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)::$_0&,std::__cxx11::string_const&,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
    ::{lambda(std::error_code_const&,asio::ip::basic_resolver_iterator<asio::ip::tcp>)#1}::
    tcp>__1____((_lambda_std__error_code_const__asio__ip__basic_resolver_iterator<asio::ip::tcp>__1_
                 *)&prVar4->handler_,(type *)local_168);
    prVar4->addrinfo_ = (addrinfo_type *)0x0;
    local_218.p = prVar4;
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_1b8._M_refcount);
    asio::detail::resolver_service_base::start_resolve_op
              (&prVar1->super_resolver_service_base,(resolve_op *)prVar4);
    local_218.v = (resolve_query_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_smasherprog[P]websocket_lite_src_ClientImpl_cpp:141:40)>
                   *)0x0;
    local_218.p = (resolve_query_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_smasherprog[P]websocket_lite_src_ClientImpl_cpp:141:40)>
                   *)0x0;
    asio::detail::
    resolve_query_op<asio::ip::tcp,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/src/ClientImpl.cpp:141:40)>
    ::ptr::~ptr(&local_218);
    Connect<SL::WS_LITE::WSClient_Configuration::connect(std::__cxx11::string_const&,SL::WS_LITE::Explicit<unsigned_short,SL::WS_LITE::INTERNAL::PorNumbertTag>,bool,std::__cxx11::string_const&,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)::$_0&>(std::shared_ptr<SL::WS_LITE::HubContext>,std::__cxx11::string_const&,SL::WS_LITE::Explicit<unsigned_short,SL::WS_LITE::INTERNAL::PorNumbertTag>,bool,SL::WS_LITE::WSClient_Configuration::connect(std::__cxx11::string_const&,SL::WS_LITE::Explicit<unsigned_short,SL::WS_LITE::INTERNAL::PorNumbertTag>,bool,std::__cxx11::string_const&,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)::$_0&,std::__cxx11::string_const&,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
    ::{lambda(std::error_code_const&,asio::ip::basic_resolver_iterator<asio::ip::tcp>)#1}::
    ~basic_resolver_iterator
              ((_lambda_std__error_code_const__asio__ip__basic_resolver_iterator<asio::ip::tcp>__1_
                *)local_168);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&connected.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&resolver.
                super___shared_ptr<asio::ip::basic_resolver<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    asio::ip::basic_resolver_query<asio::ip::tcp>::~basic_resolver_query(&query);
    std::__cxx11::string::~string((string *)&portstr);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&socket.
                super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&res.super___shared_ptr<SL::WS_LITE::ThreadContext,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    p_Var5 = &local_198;
  }
  else {
    std::__shared_ptr<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1a8,p_Var5);
    HubContext::getnextContext((HubContext *)&res);
    std::
    make_shared<SL::WS_LITE::WebSocket<false,asio::basic_stream_socket<asio::ip::tcp>>,std::shared_ptr<SL::WS_LITE::WebSocketContext>&,asio::io_context&>
              ((shared_ptr<SL::WS_LITE::WebSocketContext> *)&socket,
               (io_context *)
               &(res.super___shared_ptr<SL::WS_LITE::ThreadContext,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->WebSocketContext_);
    (socket.
     super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr)->SocketStatus_ = CONNECTING;
    std::__cxx11::to_string(&portstr,__len & 0xffff);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_168,portstr._M_dataplus._M_p,(allocator<char> *)&local_218);
    asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
              (&query,(string *)__addr,(string *)local_168,address_configured);
    std::__cxx11::string::~string((string *)local_168);
    std::make_shared<asio::ip::basic_resolver<asio::ip::tcp>,asio::io_context&>
              ((io_context *)&resolver);
    local_168._0_8_ = local_168._0_8_ & 0xffffffffffffff00;
    std::make_shared<bool,bool>((bool *)&connected);
    std::
    __shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr((__shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
                    *)local_168,
                   (__shared_ptr<SL::WS_LITE::WebSocket<false,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
                    *)&socket);
    std::__shared_ptr<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2> *)
               (local_168 + 0x10),&local_1a8);
    std::__cxx11::string::string((string *)(local_168 + 0x20),(string *)__addr);
    std::__cxx11::string::string(local_120,in_R9);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_Hashtable(&local_100,in_stack_00000008);
    std::__shared_ptr<asio::ip::basic_resolver<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr(&local_c8,
                 &resolver.
                  super___shared_ptr<asio::ip::basic_resolver<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>
                );
    std::__shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_b8,&connected.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>);
    prVar1 = ((resolver.
               super___shared_ptr<asio::ip::basic_resolver<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->super_basic_io_object<asio::detail::resolver_service<asio::ip::tcp>,_true>).
             service_;
    local_218.h = (type_conflict *)local_168;
    prVar4 = (resolve_query_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_smasherprog[P]websocket_lite_src_ClientImpl_cpp:141:40)>
              *)asio::asio_handler_allocate(0x178,(type_conflict *)local_168);
    local_218.p = (resolve_query_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_smasherprog[P]websocket_lite_src_ClientImpl_cpp:141:40)>
                   *)0x0;
    local_218.v = prVar4;
    std::__weak_ptr<void,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<void,void>
              ((__weak_ptr<void,(__gnu_cxx::_Lock_policy)2> *)&local_1b8,
               &((resolver.
                  super___shared_ptr<asio::ip::basic_resolver<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->
                super_basic_io_object<asio::detail::resolver_service<asio::ip::tcp>,_true>).
                implementation_.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>);
    piVar2 = (prVar1->super_resolver_service_base).io_context_impl_;
    asio::detail::resolve_op::resolve_op
              ((resolve_op *)prVar4,
               asio::detail::
               resolve_query_op<asio::ip::tcp,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/src/ClientImpl.cpp:141:40)>
               ::do_complete);
    std::__weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
              (&(prVar4->cancel_token_).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>,
               &local_1b8);
    asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query(&prVar4->query_,&query);
    prVar4->io_context_impl_ = piVar2;
    Connect<SL::WS_LITE::WSClient_Configuration::connect(std::__cxx11::string_const&,SL::WS_LITE::Explicit<unsigned_short,SL::WS_LITE::INTERNAL::PorNumbertTag>,bool,std::__cxx11::string_const&,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)::$_1&>(std::shared_ptr<SL::WS_LITE::HubContext>,std::__cxx11::string_const&,SL::WS_LITE::Explicit<unsigned_short,SL::WS_LITE::INTERNAL::PorNumbertTag>,bool,SL::WS_LITE::WSClient_Configuration::connect(std::__cxx11::string_const&,SL::WS_LITE::Explicit<unsigned_short,SL::WS_LITE::INTERNAL::PorNumbertTag>,bool,std::__cxx11::string_const&,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)::$_1&,std::__cxx11::string_const&,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
    ::{lambda(std::error_code_const&,asio::ip::basic_resolver_iterator<asio::ip::tcp>)#1}::
    tcp>__1____((_lambda_std__error_code_const__asio__ip__basic_resolver_iterator<asio::ip::tcp>__1_
                 *)&prVar4->handler_,(type_conflict *)local_168);
    prVar4->addrinfo_ = (addrinfo_type *)0x0;
    local_218.p = prVar4;
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_1b8._M_refcount);
    asio::detail::resolver_service_base::start_resolve_op
              (&prVar1->super_resolver_service_base,(resolve_op *)prVar4);
    local_218.v = (resolve_query_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_smasherprog[P]websocket_lite_src_ClientImpl_cpp:141:40)>
                   *)0x0;
    local_218.p = (resolve_query_op<asio::ip::tcp,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_smasherprog[P]websocket_lite_src_ClientImpl_cpp:141:40)>
                   *)0x0;
    asio::detail::
    resolve_query_op<asio::ip::tcp,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/smasherprog[P]websocket_lite/src/ClientImpl.cpp:141:40)>
    ::ptr::~ptr(&local_218);
    Connect<SL::WS_LITE::WSClient_Configuration::connect(std::__cxx11::string_const&,SL::WS_LITE::Explicit<unsigned_short,SL::WS_LITE::INTERNAL::PorNumbertTag>,bool,std::__cxx11::string_const&,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)::$_1&>(std::shared_ptr<SL::WS_LITE::HubContext>,std::__cxx11::string_const&,SL::WS_LITE::Explicit<unsigned_short,SL::WS_LITE::INTERNAL::PorNumbertTag>,bool,SL::WS_LITE::WSClient_Configuration::connect(std::__cxx11::string_const&,SL::WS_LITE::Explicit<unsigned_short,SL::WS_LITE::INTERNAL::PorNumbertTag>,bool,std::__cxx11::string_const&,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)::$_1&,std::__cxx11::string_const&,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>const&)
    ::{lambda(std::error_code_const&,asio::ip::basic_resolver_iterator<asio::ip::tcp>)#1}::
    ~basic_resolver_iterator
              ((_lambda_std__error_code_const__asio__ip__basic_resolver_iterator<asio::ip::tcp>__1_
                *)local_168);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&connected.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&resolver.
                super___shared_ptr<asio::ip::basic_resolver<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    asio::ip::basic_resolver_query<asio::ip::tcp>::~basic_resolver_query(&query);
    std::__cxx11::string::~string((string *)&portstr);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&socket.
                super___shared_ptr<SL::WS_LITE::WebSocket<false,_asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&res.super___shared_ptr<SL::WS_LITE::ThreadContext,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    p_Var5 = &local_1a8;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var5->_M_refcount);
  std::make_shared<SL::WS_LITE::WSClient,std::shared_ptr<SL::WS_LITE::HubContext>&>
            ((shared_ptr<SL::WS_LITE::HubContext> *)local_168);
  uVar3 = local_168._8_8_;
  local_168._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_IWSClient_Configuration)._vptr_IWSClient_Configuration =
       (_func_int **)local_168._0_8_;
  (this->Impl_).super___shared_ptr<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar3;
  local_168._0_8_ = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168 + 8));
  return (int)this;
}

Assistant:

std::shared_ptr<IWSHub> WSClient_Configuration::connect(const std::string &host, PortNumber port, bool no_delay, const std::string &endpoint,
                                                            const std::unordered_map<std::string, std::string> &extraheaders)
    {
        if (Impl_->TLSEnabled) {
            auto createsocket = [](const std::shared_ptr<ThreadContext> &res) {
                return std::make_shared<WebSocket<false, asio::ssl::stream<asio::ip::tcp::socket>>>(res->WebSocketContext_, res->io_service,
                                                                                                    res->context);
            };
            Connect(Impl_, host, port, no_delay, createsocket, endpoint, extraheaders);
        }
        else {
            auto createsocket = [](const std::shared_ptr<ThreadContext> &res) {
                return std::make_shared<WebSocket<false, asio::ip::tcp::socket>>(res->WebSocketContext_, res->io_service);
            };
            Connect(Impl_, host, port, no_delay, createsocket, endpoint, extraheaders);
        }
        return std::make_shared<WSClient>(Impl_);
    }